

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsImplications.cpp
# Opt level: O0

void __thiscall
HighsImplications::rebuild
          (HighsImplications *this,HighsInt ncols,vector<int,_std::allocator<int>_> *orig2reducedcol
          ,vector<int,_std::allocator<int>_> *orig2reducedrow)

{
  bool bVar1;
  HighsInt col;
  size_type sVar2;
  const_reference pvVar3;
  vector<int,_std::allocator<int>_> *in_RDX;
  HighsInt *in_RDI;
  HighsInt newi;
  HighsInt i;
  HighsInt oldncols;
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  oldvlbs;
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  oldvubs;
  undefined4 in_stack_ffffffffffffff28;
  HighsPostsolveStack *this_00;
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  *in_stack_ffffffffffffff38;
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  *in_stack_ffffffffffffff40;
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  *this_01;
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  *__new_size;
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  *this_02;
  int local_64;
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  local_50;
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  local_38;
  vector<int,_std::allocator<int>_> *local_18;
  
  this_02 = &local_38;
  local_18 = in_RDX;
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::vector((vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
            *)0x5ecc75);
  __new_size = &local_50;
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::vector((vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
            *)0x5ecc87);
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::swap(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::swap(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x5eccc0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::shrink_to_fit
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x5eccca);
  this_01 = (vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
             *)(in_RDI + 2);
  std::vector<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>::clear
            ((vector<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_> *)
             0x5eccdf);
  std::vector<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>::
  shrink_to_fit((vector<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_> *)
                0x5ecce9);
  std::vector<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_>::resize
            ((vector<HighsImplications::Implics,_std::allocator<HighsImplications::Implics>_> *)
             this_02,(size_type)__new_size);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_02,(size_type)__new_size)
  ;
  std::vector<HighsSubstitution,_std::allocator<HighsSubstitution>_>::clear
            ((vector<HighsSubstitution,_std::allocator<HighsSubstitution>_> *)0x5ecd2d);
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::clear((vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
           *)0x5ecd40);
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::shrink_to_fit((vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
                   *)0x5ecd4a);
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::resize(this_02,(size_type)__new_size);
  this_00 = (HighsPostsolveStack *)(in_RDI + 0x10);
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::clear((vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
           *)0x5ecd77);
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::shrink_to_fit((vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
                   *)0x5ecd81);
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::resize(this_02,(size_type)__new_size);
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  sVar2 = std::
          vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
          ::size(&local_38);
  col = HighsMipSolver::numNonzero((HighsMipSolver *)0x5ecdca);
  *in_RDI = col;
  for (local_64 = 0; local_64 != (int)sVar2; local_64 = local_64 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_18,(long)local_64);
    if (*pvVar3 != -1) {
      std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                 0x5ece25);
      bVar1 = presolve::HighsPostsolveStack::isColLinearlyTransformable(this_00,col);
      in_stack_ffffffffffffff28 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff28);
      if (bVar1) {
        std::
        vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
        ::operator[](&local_38,(long)local_64);
        HighsHashTree<int,HighsImplications::VarBound>::
        for_each<HighsImplications::rebuild(int,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&)::__0>
                  ((HighsHashTree<int,_HighsImplications::VarBound> *)this_00,
                   (anon_class_24_3_68744407 *)CONCAT44(col,in_stack_ffffffffffffff28));
        std::
        vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
        ::operator[](&local_50,(long)local_64);
        HighsHashTree<int,HighsImplications::VarBound>::
        for_each<HighsImplications::rebuild(int,std::vector<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&)::__1>
                  ((HighsHashTree<int,_HighsImplications::VarBound> *)this_00,
                   (anon_class_24_3_68744407 *)CONCAT44(col,in_stack_ffffffffffffff28));
      }
    }
  }
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::~vector(this_01);
  std::
  vector<HighsHashTree<int,_HighsImplications::VarBound>,_std::allocator<HighsHashTree<int,_HighsImplications::VarBound>_>_>
  ::~vector(this_01);
  return;
}

Assistant:

void HighsImplications::rebuild(HighsInt ncols,
                                const std::vector<HighsInt>& orig2reducedcol,
                                const std::vector<HighsInt>& orig2reducedrow) {
  std::vector<HighsHashTree<HighsInt, VarBound>> oldvubs;
  std::vector<HighsHashTree<HighsInt, VarBound>> oldvlbs;

  oldvlbs.swap(vlbs);
  oldvubs.swap(vubs);

  colsubstituted.clear();
  colsubstituted.shrink_to_fit();
  implications.clear();
  implications.shrink_to_fit();

  implications.resize(2 * ncols);
  colsubstituted.resize(ncols);
  substitutions.clear();
  vubs.clear();
  vubs.shrink_to_fit();
  vubs.resize(ncols);
  vlbs.clear();
  vlbs.shrink_to_fit();
  vlbs.resize(ncols);
  numImplications = 0;
  HighsInt oldncols = oldvubs.size();

  nextCleanupCall = mipsolver.numNonzero();

  for (HighsInt i = 0; i != oldncols; ++i) {
    HighsInt newi = orig2reducedcol[i];

    if (newi == -1 ||
        !mipsolver.mipdata_->postSolveStack.isColLinearlyTransformable(newi))
      continue;

    oldvubs[i].for_each([&](HighsInt vubCol, VarBound vub) {
      HighsInt newVubCol = orig2reducedcol[vubCol];
      if (newVubCol == -1) return;

      if (!mipsolver.mipdata_->domain.isBinary(newVubCol) ||
          !mipsolver.mipdata_->postSolveStack.isColLinearlyTransformable(
              newVubCol))
        return;

      addVUB(newi, newVubCol, vub.coef, vub.constant);
    });

    oldvlbs[i].for_each([&](HighsInt vlbCol, VarBound vlb) {
      HighsInt newVlbCol = orig2reducedcol[vlbCol];
      if (newVlbCol == -1) return;

      if (!mipsolver.mipdata_->domain.isBinary(newVlbCol) ||
          !mipsolver.mipdata_->postSolveStack.isColLinearlyTransformable(
              newVlbCol))
        return;

      addVLB(newi, newVlbCol, vlb.coef, vlb.constant);
    });

    // todo also add old implications once implications can be added
    // incrementally for now we discard the old implications as they might be
    // weaker then newly computed ones and adding them would block computation
    // of new implications
  }
}